

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

void __thiscall
QPDFWriter::setEncryptionParametersInternal
          (QPDFWriter *this,int V,int R,int key_len,int P,string *O,string *U,string *OE,string *UE,
          string *Perms,string *id1,string *user_password,string *encryption_key)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  mapped_type *pmVar2;
  undefined4 in_register_0000000c;
  EncryptionData *data;
  char *pcVar3;
  char *__s;
  int P_00;
  element_type *peVar4;
  string *O_00;
  key_type local_288;
  allocator<char> local_262;
  allocator<char> local_261;
  key_type local_260;
  int local_23c;
  string *local_238;
  EncryptionData *local_230;
  EncryptionData encryption_data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  size_type local_c8;
  char local_c0 [8];
  undefined8 uStack_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  size_type local_a8;
  char local_a0 [8];
  undefined8 uStack_98;
  key_type local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_230 = (EncryptionData *)CONCAT44(in_register_0000000c,key_len);
  peVar4 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar4->encryption_V = V;
  peVar4->encryption_R = R;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&encryption_data,"/Filter",(allocator<char> *)&local_288);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&peVar4->encryption_dictionary,(key_type *)&encryption_data);
  std::__cxx11::string::assign((char *)pmVar2);
  std::__cxx11::string::~string((string *)&encryption_data);
  std::__cxx11::to_string((string *)&encryption_data,V);
  peVar4 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,"/V",(allocator<char> *)&local_260);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&peVar4->encryption_dictionary,&local_288);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&encryption_data);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&encryption_data);
  std::__cxx11::to_string((string *)&encryption_data,(int)local_230 * 8);
  peVar4 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,"/Length",(allocator<char> *)&local_260);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&peVar4->encryption_dictionary,&local_288);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&encryption_data);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&encryption_data);
  std::__cxx11::to_string((string *)&encryption_data,R);
  peVar4 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,"/R",(allocator<char> *)&local_260);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&peVar4->encryption_dictionary,&local_288);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&encryption_data);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&encryption_data);
  std::__cxx11::to_string((string *)&encryption_data,P);
  peVar4 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,"/P",(allocator<char> *)&local_260);
  local_23c = P;
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&peVar4->encryption_dictionary,&local_288);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&encryption_data);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&encryption_data);
  local_238 = O;
  std::__cxx11::string::string((string *)&local_b0,(string *)O);
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  if (local_b0 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0) {
    local_288.field_2._8_8_ = uStack_98;
  }
  else {
    local_288._M_dataplus._M_p = (pointer)local_b0;
  }
  local_288._M_string_length = local_a8;
  local_a8 = 0;
  local_a0[0] = '\0';
  local_b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_a0;
  QPDF_String::unparse_abi_cxx11_((string *)&encryption_data,(QPDF_String *)&local_288,true);
  peVar4 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"/O",(allocator<char> *)&local_150);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&peVar4->encryption_dictionary,&local_260);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&encryption_data);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&encryption_data);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_d0,(string *)U);
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  if (local_d0 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0) {
    local_288.field_2._8_8_ = uStack_b8;
  }
  else {
    local_288._M_dataplus._M_p = (pointer)local_d0;
  }
  local_288._M_string_length = local_c8;
  local_c8 = 0;
  local_c0[0] = '\0';
  local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_c0;
  QPDF_String::unparse_abi_cxx11_((string *)&encryption_data,(QPDF_String *)&local_288,true);
  peVar4 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"/U",(allocator<char> *)&local_150);
  paVar1 = &local_288.field_2;
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&peVar4->encryption_dictionary,&local_260);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&encryption_data);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&encryption_data);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_d0);
  if (4 < V) {
    std::__cxx11::string::string((string *)&local_f0,(string *)OE);
    if (local_f0 == &local_e0) {
      local_288.field_2._8_8_ = local_e0._8_8_;
      local_288._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_288._M_dataplus._M_p = (pointer)local_f0;
    }
    local_288._M_string_length = local_e8;
    local_e8 = 0;
    local_e0._M_local_buf[0] = '\0';
    local_f0 = &local_e0;
    QPDF_String::unparse_abi_cxx11_((string *)&encryption_data,(QPDF_String *)&local_288,true);
    peVar4 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"/OE",(allocator<char> *)&local_150);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&peVar4->encryption_dictionary,&local_260);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&encryption_data);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&encryption_data);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::string((string *)&local_110,(string *)UE);
    if (local_110 == &local_100) {
      local_288.field_2._8_8_ = local_100._8_8_;
      local_288._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_288._M_dataplus._M_p = (pointer)local_110;
    }
    local_288._M_string_length = local_108;
    local_108 = 0;
    local_100._M_local_buf[0] = '\0';
    local_110 = &local_100;
    QPDF_String::unparse_abi_cxx11_((string *)&encryption_data,(QPDF_String *)&local_288,true);
    peVar4 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"/UE",(allocator<char> *)&local_150);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&peVar4->encryption_dictionary,&local_260);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&encryption_data);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&encryption_data);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::string((string *)&local_130,(string *)Perms);
    if (local_130 == &local_120) {
      local_288.field_2._8_8_ = local_120._8_8_;
      local_288._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_288._M_dataplus._M_p = (pointer)local_130;
    }
    local_288._M_string_length = local_128;
    local_128 = 0;
    local_120._M_local_buf[0] = '\0';
    local_130 = &local_120;
    QPDF_String::unparse_abi_cxx11_((string *)&encryption_data,(QPDF_String *)&local_288,true);
    peVar4 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"/Perms",(allocator<char> *)&local_150);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&peVar4->encryption_dictionary,&local_260);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&encryption_data);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&encryption_data);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_130);
  }
  O_00 = local_238;
  P_00 = local_23c;
  if (R < 6) {
    if (R != 3) {
      if (R == 4) {
        pcVar3 = "1.5";
        if (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            encrypt_use_aes != false) {
          pcVar3 = "1.6";
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&encryption_data,pcVar3,(allocator<char> *)&local_288);
        setMinimumPDFVersion(this,(string *)&encryption_data,0);
      }
      else {
        if (R != 5) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&encryption_data,"1.3",(allocator<char> *)&local_288);
          setMinimumPDFVersion(this,(string *)&encryption_data,0);
          goto LAB_001b45c1;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&encryption_data,"1.7",(allocator<char> *)&local_288);
        setMinimumPDFVersion(this,(string *)&encryption_data,3);
      }
      goto LAB_001b44a5;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&encryption_data,"1.4",(allocator<char> *)&local_288);
    setMinimumPDFVersion(this,(string *)&encryption_data,0);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&encryption_data,"1.7",(allocator<char> *)&local_288);
    O_00 = local_238;
    P_00 = local_23c;
    setMinimumPDFVersion(this,(string *)&encryption_data,8);
LAB_001b44a5:
    std::__cxx11::string::~string((string *)&encryption_data);
    peVar4 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar4->encrypt_metadata != false) goto LAB_001b45cb;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&encryption_data,"/EncryptMetadata",(allocator<char> *)&local_288);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&peVar4->encryption_dictionary,(key_type *)&encryption_data);
    std::__cxx11::string::assign((char *)pmVar2);
  }
LAB_001b45c1:
  std::__cxx11::string::~string((string *)&encryption_data);
LAB_001b45cb:
  peVar4 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((V & 0xfffffffeU) == 4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&encryption_data,"/StmF",(allocator<char> *)&local_288);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&peVar4->encryption_dictionary,(key_type *)&encryption_data);
    std::__cxx11::string::assign((char *)pmVar2);
    std::__cxx11::string::~string((string *)&encryption_data);
    peVar4 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&encryption_data,"/StrF",(allocator<char> *)&local_288);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&peVar4->encryption_dictionary,(key_type *)&encryption_data);
    std::__cxx11::string::assign((char *)pmVar2);
    std::__cxx11::string::~string((string *)&encryption_data);
    pcVar3 = "/AESV3";
    if ((uint)V < 5) {
      pcVar3 = "/AESV2";
    }
    __s = "/V2";
    if (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        encrypt_use_aes != false) {
      __s = pcVar3;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&encryption_data,__s,(allocator<char> *)&local_288);
    std::operator+(&local_50,"<< /StdCF << /AuthEvent /DocOpen /CFM ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &encryption_data);
    std::operator+(&local_150,&local_50," /Length ");
    pcVar3 = "32";
    if ((uint)V < 5) {
      pcVar3 = "16";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar3,&local_261);
    std::operator+(&local_260,&local_150,&local_70);
    std::operator+(&local_288,&local_260," >> >>");
    peVar4 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"/CF",&local_262);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&peVar4->encryption_dictionary,&local_90);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_288);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&encryption_data);
    peVar4 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  peVar4->encrypted = true;
  data = local_230;
  QPDF::EncryptionData::EncryptionData
            (&encryption_data,V,R,(int)local_230,P_00,O_00,U,OE,UE,Perms,id1,
             peVar4->encrypt_metadata);
  if (V < 5) {
    QPDF::compute_encryption_key(&local_288,(QPDF *)user_password,(string *)&encryption_data,data);
    std::__cxx11::string::operator=
              ((string *)
               &((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->encryption_key,(string *)&local_288);
    std::__cxx11::string::~string((string *)&local_288);
  }
  else {
    std::__cxx11::string::_M_assign
              ((string *)
               &((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->encryption_key);
  }
  QPDF::EncryptionData::~EncryptionData(&encryption_data);
  return;
}

Assistant:

void
QPDFWriter::setEncryptionParametersInternal(
    int V,
    int R,
    int key_len,
    int P,
    std::string const& O,
    std::string const& U,
    std::string const& OE,
    std::string const& UE,
    std::string const& Perms,
    std::string const& id1,
    std::string const& user_password,
    std::string const& encryption_key)
{
    m->encryption_V = V;
    m->encryption_R = R;
    m->encryption_dictionary["/Filter"] = "/Standard";
    m->encryption_dictionary["/V"] = std::to_string(V);
    m->encryption_dictionary["/Length"] = std::to_string(key_len * 8);
    m->encryption_dictionary["/R"] = std::to_string(R);
    m->encryption_dictionary["/P"] = std::to_string(P);
    m->encryption_dictionary["/O"] = QPDF_String(O).unparse(true);
    m->encryption_dictionary["/U"] = QPDF_String(U).unparse(true);
    if (V >= 5) {
        m->encryption_dictionary["/OE"] = QPDF_String(OE).unparse(true);
        m->encryption_dictionary["/UE"] = QPDF_String(UE).unparse(true);
        m->encryption_dictionary["/Perms"] = QPDF_String(Perms).unparse(true);
    }
    if (R >= 6) {
        setMinimumPDFVersion("1.7", 8);
    } else if (R == 5) {
        setMinimumPDFVersion("1.7", 3);
    } else if (R == 4) {
        setMinimumPDFVersion(m->encrypt_use_aes ? "1.6" : "1.5");
    } else if (R == 3) {
        setMinimumPDFVersion("1.4");
    } else {
        setMinimumPDFVersion("1.3");
    }

    if ((R >= 4) && (!m->encrypt_metadata)) {
        m->encryption_dictionary["/EncryptMetadata"] = "false";
    }
    if ((V == 4) || (V == 5)) {
        // The spec says the value for the crypt filter key can be anything, and xpdf seems to
        // agree.  However, Adobe Reader won't open our files unless we use /StdCF.
        m->encryption_dictionary["/StmF"] = "/StdCF";
        m->encryption_dictionary["/StrF"] = "/StdCF";
        std::string method = (m->encrypt_use_aes ? ((V < 5) ? "/AESV2" : "/AESV3") : "/V2");
        // The PDF spec says the /Length key is optional, but the PDF previewer on some versions of
        // MacOS won't open encrypted files without it.
        m->encryption_dictionary["/CF"] = "<< /StdCF << /AuthEvent /DocOpen /CFM " + method +
            " /Length " + std::string((V < 5) ? "16" : "32") + " >> >>";
    }

    m->encrypted = true;
    QPDF::EncryptionData encryption_data(
        V, R, key_len, P, O, U, OE, UE, Perms, id1, m->encrypt_metadata);
    if (V < 5) {
        m->encryption_key = QPDF::compute_encryption_key(user_password, encryption_data);
    } else {
        m->encryption_key = encryption_key;
    }
}